

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O1

int is_pure(boolean talk)

{
  aligntyp alignment;
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  
  alignment = u.ualignbase[1];
  if ((talk != '\0') && (flags.debug != '\0')) {
    if (u.ualign.type == u.ualignbase[1]) {
      if (u.ualignbase[0] == u.ualignbase[1]) {
        uVar5 = 0x14;
        if (moves < 0x898) {
          uVar5 = (ulong)(moves / 200 + 10);
        }
        if ((long)u.ualign.record < (long)uVar5) {
          uVar5 = 0x14;
          if (moves < 0x898) {
            uVar5 = (ulong)(moves / 200 + 10);
          }
          pline("You are currently %d and require %d.",(long)u.ualign.record,uVar5);
          cVar1 = yn_function("adjust?","yn",'y');
          if ((cVar1 == 'y') && (u.ualign.record = 0x14, moves < 0x898)) {
            u.ualign.record = moves / 200 + 10;
          }
        }
      }
      else {
        pline("You have converted.");
      }
    }
    else {
      pcVar3 = align_str(u.ualign.type);
      pcVar4 = align_str(alignment);
      pline("You are currently %s instead of %s.",pcVar3,pcVar4);
    }
  }
  uVar5 = 0x14;
  if (moves < 0x898) {
    uVar5 = (ulong)(moves / 200 + 10);
  }
  iVar2 = 1;
  if (u.ualignbase[0] != alignment || u.ualign.type != alignment) {
    iVar2 = -(uint)(u.ualignbase[0] != alignment);
  }
  if ((long)u.ualign.record < (long)uVar5) {
    iVar2 = -(uint)(u.ualignbase[0] != alignment);
  }
  return iVar2;
}

Assistant:

static int is_pure(boolean talk)
{
    int purity;
    aligntyp original_alignment = u.ualignbase[A_ORIGINAL];

    if (wizard && talk) {
	if (u.ualign.type != original_alignment) {
	    pline("You are currently %s instead of %s.",
		align_str(u.ualign.type), align_str(original_alignment));
	} else if (u.ualignbase[A_CURRENT] != original_alignment) {
	    pline("You have converted.");
	} else if (u.ualign.record < MIN_QUEST_ALIGN) {
	    pline("You are currently %d and require %d.",
		u.ualign.record, MIN_QUEST_ALIGN);
	    if (yn_function("adjust?", ynchars, 'y') == 'y')
		u.ualign.record = MIN_QUEST_ALIGN;
	}
    }
    
    purity = (u.ualign.record >= MIN_QUEST_ALIGN &&
	      u.ualign.type == original_alignment &&
	      u.ualignbase[A_CURRENT] == original_alignment) ?  1 :
	     (u.ualignbase[A_CURRENT] != original_alignment) ? -1 : 0;
    return purity;
}